

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O2

ostream * sciplot::internal::
          writeline<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<double,std::allocator<double>>>
                    (ostream *out,size_t i,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *v,vector<double,_std::allocator<double>_> *args)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  escapeIfNeeded<std::__cxx11::string>
            (&local_40,
             (internal *)
             ((v->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + i),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)v);
  poVar1 = std::operator<<(out,(string *)&local_40);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string((string *)&local_40);
  writeline<std::vector<double,std::allocator<double>>>(out,i,args);
  return out;
}

Assistant:

auto writeline(std::ostream& out, std::size_t i, const VectorType& v, const Args&... args) -> std::ostream&
{
    out << escapeIfNeeded(v[i]) << " ";
    writeline(out, i, args...);
    return out;
}